

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char_const(&)[24],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&>
                   (string *__return_storage_ptr__,char (*a) [24],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [9],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  size_type local_78;
  pointer local_70;
  undefined8 local_68;
  size_t local_60;
  char (*local_58) [9];
  undefined8 local_50;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  
  local_90.first._M_len = strlen(*a);
  local_90.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70 = (b->_M_dataplus)._M_p;
  local_78 = b->_M_string_length;
  local_68 = 0;
  local_90.first._M_str = *a;
  local_60 = strlen(*args);
  local_50 = 0;
  local_40 = (args_1->_M_dataplus)._M_p;
  local_48 = args_1->_M_string_length;
  local_38 = 0;
  views._M_len = 4;
  views._M_array = &local_90;
  local_58 = args;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}